

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O1

void ReadRegTestArgs(ArgsManager *args,RegTestOptions *options)

{
  long lVar1;
  pointer __s;
  int32_t iVar2;
  int64_t iVar3;
  bool bVar4;
  optional<bool> oVar5;
  int iVar6;
  void *pvVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  runtime_error *prVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  undefined8 uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  _Alloc_hider _Var14;
  char *in_R8;
  VBDeploymentInfo *pVVar15;
  long lVar16;
  long in_FS_OFFSET;
  string_view str;
  string_view name;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view logging_function;
  string_view separators;
  string_view source_file;
  optional<Consensus::BuriedDeployment> buried_deployment;
  int32_t height;
  VersionBitsParameters vbparams;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vDeploymentParams;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> deployment_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  value._M_dataplus._M_p = (pointer)&value.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&value,"-fastprune","");
  oVar5 = ArgsManager::GetBoolArg(args,&value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value._M_dataplus._M_p != &value.field_2) {
    operator_delete(value._M_dataplus._M_p,value.field_2._M_allocated_capacity + 1);
  }
  if (((ushort)oVar5.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    options->fastprune =
         oVar5.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
         _M_payload;
  }
  value._M_dataplus._M_p = (pointer)&value.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&value,"-testactivationheight","");
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&vbparams,args,&value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value._M_dataplus._M_p != &value.field_2) {
    operator_delete(value._M_dataplus._M_p,value.field_2._M_allocated_capacity + 1);
  }
  iVar3 = vbparams.timeout;
  if (vbparams.start_time != vbparams.timeout) {
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              vbparams.start_time;
    do {
      pbVar11 = in_RCX;
      in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0xffffffffffffffff;
      if (pbVar13->_M_string_length != 0) {
        __s = (pbVar13->_M_dataplus)._M_p;
        pvVar7 = memchr(__s,0x40,pbVar13->_M_string_length);
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)pvVar7 - (long)__s);
        in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (-(ulong)(pvVar7 == (void *)0x0) | (ulong)pbVar11);
      }
      if (in_RCX == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    0xffffffffffffffff) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<std::__cxx11::string>
                  (&value,(tinyformat *)"Invalid format (%s) for -testactivationheight=name@height."
                   ,(char *)pbVar13,pbVar11);
        std::runtime_error::runtime_error(prVar10,(string *)&value);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0032e612;
      }
      uVar12 = 0xffffffffffffffff;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&value,pbVar13,(size_type)((long)&(in_RCX->_M_dataplus)._M_p + 1),
                 0xffffffffffffffff);
      str._M_str = value._M_dataplus._M_p;
      str._M_len = value._M_string_length;
      bVar4 = ParseInt32(str,&height);
      pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT71((int7)((ulong)uVar12 >> 8),(uint)height < 0x7fffffff);
      if (!bVar4 || (uint)height >= 0x7fffffff) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<std::__cxx11::string>
                  (&deployment_name,
                   (tinyformat *)"Invalid height value (%s) for -testactivationheight=name@height.",
                   (char *)pbVar13,pbVar11);
        std::runtime_error::runtime_error(prVar10,(string *)&deployment_name);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0032e612;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&deployment_name,pbVar13,0,(size_type)in_RCX);
      name._M_str = deployment_name._M_dataplus._M_p;
      name._M_len = deployment_name._M_string_length;
      buried_deployment = GetBuriedDeployment(name);
      iVar2 = height;
      if (buried_deployment.super__Optional_base<Consensus::BuriedDeployment,_true,_true>._M_payload
          .super__Optional_payload_base<Consensus::BuriedDeployment>._M_engaged != true) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<std::__cxx11::string>
                  ((string *)&vDeploymentParams,
                   (tinyformat *)"Invalid name (%s) for -testactivationheight=name@height.",
                   (char *)pbVar13,in_RCX);
        std::runtime_error::runtime_error(prVar10,(string *)&vDeploymentParams);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0032e612;
      }
      pmVar8 = std::__detail::
               _Map_base<Consensus::BuriedDeployment,_std::pair<const_Consensus::BuriedDeployment,_int>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::BuriedDeployment>,_std::hash<Consensus::BuriedDeployment>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<Consensus::BuriedDeployment,_std::pair<const_Consensus::BuriedDeployment,_int>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::BuriedDeployment>,_std::hash<Consensus::BuriedDeployment>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&options->activation_heights,(key_type *)&buried_deployment);
      *pmVar8 = iVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)deployment_name._M_dataplus._M_p != &deployment_name.field_2) {
        operator_delete(deployment_name._M_dataplus._M_p,
                        deployment_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value._M_dataplus._M_p != &value.field_2) {
        operator_delete(value._M_dataplus._M_p,value.field_2._M_allocated_capacity + 1);
      }
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&vbparams);
  value._M_dataplus._M_p = (pointer)&value.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&value,"-vbparams","");
  bVar4 = ArgsManager::IsArgSet(args,&value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value._M_dataplus._M_p != &value.field_2) {
    operator_delete(value._M_dataplus._M_p,value.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    value._M_dataplus._M_p = (pointer)&value.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&value,"-vbparams","");
    ArgsManager::GetArgs
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&deployment_name,args,&value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value._M_dataplus._M_p != &value.field_2) {
      operator_delete(value._M_dataplus._M_p,value.field_2._M_allocated_capacity + 1);
    }
    if (deployment_name._M_dataplus._M_p != (pointer)deployment_name._M_string_length) {
      _Var14._M_p = deployment_name._M_dataplus._M_p;
      do {
        value._M_dataplus._M_p = *_Var14._M_p;
        value._M_string_length = *(size_type *)(_Var14._M_p + 8);
        vbparams.start_time = CONCAT71(vbparams.start_time._1_7_,0x3a);
        separators._M_str = in_R8;
        separators._M_len = (size_t)&vbparams;
        util::Split<std::__cxx11::string>
                  (&vDeploymentParams,(util *)&value,(Span<const_char> *)0x1,separators);
        pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (((long)vDeploymentParams.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vDeploymentParams.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) - 5);
        if (pbVar13 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      0xfffffffffffffffe) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar10,
                     "Version bits parameters malformed, expecting deployment:start:end[:min_activation_height]"
                    );
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_0032e612;
        }
        vbparams.start_time = 0;
        vbparams.timeout = 0;
        vbparams.min_activation_height = 0;
        vbparams._20_4_ = 0;
        str_00._M_str =
             vDeploymentParams.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        str_00._M_len =
             vDeploymentParams.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
        bVar4 = ParseInt64(str_00,&vbparams.start_time);
        if (!bVar4) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          tinyformat::format<std::__cxx11::string>
                    (&value,(tinyformat *)"Invalid nStartTime (%s)",
                     (char *)(vDeploymentParams.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1),pbVar13);
          std::runtime_error::runtime_error(prVar10,(string *)&value);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_0032e612;
        }
        str_01._M_str =
             vDeploymentParams.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
        str_01._M_len =
             vDeploymentParams.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length;
        bVar4 = ParseInt64(str_01,&vbparams.timeout);
        if (!bVar4) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          tinyformat::format<std::__cxx11::string>
                    (&value,(tinyformat *)"Invalid nTimeout (%s)",
                     (char *)(vDeploymentParams.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 2),pbVar13);
          std::runtime_error::runtime_error(prVar10,(string *)&value);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_0032e612;
        }
        pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)vDeploymentParams.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)vDeploymentParams.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        if (pbVar13 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x61) {
          vbparams._16_8_ = vbparams._16_8_ & 0xffffffff00000000;
        }
        else {
          str_02._M_str =
               vDeploymentParams.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
          str_02._M_len =
               vDeploymentParams.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[3]._M_string_length;
          bVar4 = ParseInt32(str_02,&vbparams.min_activation_height);
          if (!bVar4) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            tinyformat::format<std::__cxx11::string>
                      (&value,(tinyformat *)"Invalid min_activation_height (%s)",
                       (char *)(vDeploymentParams.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 3),pbVar13);
            std::runtime_error::runtime_error(prVar10,(string *)&value);
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_0032e612;
          }
        }
        pVVar15 = VersionBitsDeploymentInfo;
        lVar16 = 0;
        while( true ) {
          iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(vDeploymentParams.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,pVVar15->name);
          if (iVar6 == 0) break;
          lVar16 = lVar16 + 1;
          pVVar15 = pVVar15 + 1;
          if (lVar16 != 1) {
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            tinyformat::format<std::__cxx11::string>
                      (&value,(tinyformat *)"Invalid deployment (%s)",
                       (char *)vDeploymentParams.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,pbVar13);
            std::runtime_error::runtime_error(prVar10,(string *)&value);
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_0032e612;
          }
        }
        value._M_dataplus._M_p._0_2_ = (short)lVar16;
        pmVar9 = std::__detail::
                 _Map_base<Consensus::DeploymentPos,_std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::DeploymentPos>,_std::hash<Consensus::DeploymentPos>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<Consensus::DeploymentPos,_std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::DeploymentPos>,_std::hash<Consensus::DeploymentPos>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)options,(key_type *)&value);
        pmVar9->min_activation_height = vbparams.min_activation_height;
        *(undefined4 *)&pmVar9->field_0x14 = vbparams._20_4_;
        pmVar9->start_time = vbparams.start_time;
        pmVar9->timeout = vbparams.timeout;
        in_R8 = (char *)0x5e;
        logging_function._M_str = "ReadRegTestArgs";
        logging_function._M_len = 0xf;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chainparams.cpp"
        ;
        source_file._M_len = 0x5f;
        LogPrintFormatInternal<std::__cxx11::string,long,long,int>
                  (logging_function,source_file,0x5e,ALL,Info,(ConstevalFormatString<4U>)0x4c1400,
                   vDeploymentParams.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,&vbparams.start_time,&vbparams.timeout,
                   &vbparams.min_activation_height);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vDeploymentParams);
        _Var14._M_p = _Var14._M_p + 0x20;
      } while (_Var14._M_p != (pointer)deployment_name._M_string_length);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&deployment_name);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0032e612:
  __stack_chk_fail();
}

Assistant:

void ReadRegTestArgs(const ArgsManager& args, CChainParams::RegTestOptions& options)
{
    if (auto value = args.GetBoolArg("-fastprune")) options.fastprune = *value;

    for (const std::string& arg : args.GetArgs("-testactivationheight")) {
        const auto found{arg.find('@')};
        if (found == std::string::npos) {
            throw std::runtime_error(strprintf("Invalid format (%s) for -testactivationheight=name@height.", arg));
        }

        const auto value{arg.substr(found + 1)};
        int32_t height;
        if (!ParseInt32(value, &height) || height < 0 || height >= std::numeric_limits<int>::max()) {
            throw std::runtime_error(strprintf("Invalid height value (%s) for -testactivationheight=name@height.", arg));
        }

        const auto deployment_name{arg.substr(0, found)};
        if (const auto buried_deployment = GetBuriedDeployment(deployment_name)) {
            options.activation_heights[*buried_deployment] = height;
        } else {
            throw std::runtime_error(strprintf("Invalid name (%s) for -testactivationheight=name@height.", arg));
        }
    }

    if (!args.IsArgSet("-vbparams")) return;

    for (const std::string& strDeployment : args.GetArgs("-vbparams")) {
        std::vector<std::string> vDeploymentParams = SplitString(strDeployment, ':');
        if (vDeploymentParams.size() < 3 || 4 < vDeploymentParams.size()) {
            throw std::runtime_error("Version bits parameters malformed, expecting deployment:start:end[:min_activation_height]");
        }
        CChainParams::VersionBitsParameters vbparams{};
        if (!ParseInt64(vDeploymentParams[1], &vbparams.start_time)) {
            throw std::runtime_error(strprintf("Invalid nStartTime (%s)", vDeploymentParams[1]));
        }
        if (!ParseInt64(vDeploymentParams[2], &vbparams.timeout)) {
            throw std::runtime_error(strprintf("Invalid nTimeout (%s)", vDeploymentParams[2]));
        }
        if (vDeploymentParams.size() >= 4) {
            if (!ParseInt32(vDeploymentParams[3], &vbparams.min_activation_height)) {
                throw std::runtime_error(strprintf("Invalid min_activation_height (%s)", vDeploymentParams[3]));
            }
        } else {
            vbparams.min_activation_height = 0;
        }
        bool found = false;
        for (int j=0; j < (int)Consensus::MAX_VERSION_BITS_DEPLOYMENTS; ++j) {
            if (vDeploymentParams[0] == VersionBitsDeploymentInfo[j].name) {
                options.version_bits_parameters[Consensus::DeploymentPos(j)] = vbparams;
                found = true;
                LogPrintf("Setting version bits activation parameters for %s to start=%ld, timeout=%ld, min_activation_height=%d\n", vDeploymentParams[0], vbparams.start_time, vbparams.timeout, vbparams.min_activation_height);
                break;
            }
        }
        if (!found) {
            throw std::runtime_error(strprintf("Invalid deployment (%s)", vDeploymentParams[0]));
        }
    }
}